

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O0

int __thiscall Character::CanHoldItem(Character *this,short itemid,int max_amount)

{
  World *pWVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  mapped_type *pmVar5;
  int *piVar6;
  allocator<char> local_b1;
  key_type local_b0;
  int local_90;
  int local_8c;
  EIF_Data *local_88;
  EIF_Data *item;
  key_type local_78;
  allocator<char> local_41;
  key_type local_40;
  int local_1c;
  int local_18;
  int amount;
  int max_amount_local;
  short itemid_local;
  Character *this_local;
  
  pWVar1 = this->world;
  local_1c = max_amount;
  local_18 = max_amount;
  amount._2_2_ = itemid;
  _max_amount_local = this;
  std::allocator<char>::allocator();
  item._6_1_ = 0;
  item._5_1_ = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"EnforceWeight",&local_41);
  pmVar5 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(pWVar1->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_40);
  iVar3 = util::variant::operator_cast_to_int(pmVar5);
  bVar2 = false;
  if (1 < iVar3) {
    uVar4 = (*(this->super_Command_Source)._vptr_Command_Source[1])();
    pWVar1 = this->world;
    std::allocator<char>::allocator();
    item._6_1_ = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"unlimitedweight",(allocator<char> *)((long)&item + 7));
    item._5_1_ = 1;
    pmVar5 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
             ::operator[](&(pWVar1->config).
                           super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                          ,&local_78);
    iVar3 = util::variant::operator_cast_to_int(pmVar5);
    bVar2 = (int)(uVar4 & 0xff) < iVar3;
  }
  if ((item._5_1_ & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_78);
  }
  if ((item._6_1_ & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)((long)&item + 7));
  }
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  if (bVar2) {
    local_88 = EIF::Get(this->world->eif,(int)amount._2_2_);
    if (this->maxweight < this->weight) {
      local_1c = 0;
    }
    else {
      bVar2 = EIF_Data_Base::operator_cast_to_bool((EIF_Data_Base *)local_88);
      if ((bVar2) && (local_88->weight != '\0')) {
        local_8c = (this->maxweight - this->weight) / (int)(uint)local_88->weight;
        piVar6 = std::min<int>(&local_8c,&local_18);
        local_1c = *piVar6;
      }
      else {
        local_1c = local_18;
      }
    }
  }
  pWVar1 = this->world;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"MaxItem",&local_b1);
  pmVar5 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(pWVar1->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_b0);
  local_90 = util::variant::operator_cast_to_int(pmVar5);
  piVar6 = std::min<int>(&local_1c,&local_90);
  iVar3 = *piVar6;
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  return iVar3;
}

Assistant:

int Character::CanHoldItem(short itemid, int max_amount)
{
	int amount = max_amount;

	if (int(this->world->config["EnforceWeight"]) >= 2
	 && SourceDutyAccess() < static_cast<int>(world->config["unlimitedweight"]))
	{
		const EIF_Data &item = this->world->eif->Get(itemid);

		if (this->weight > this->maxweight)
			amount = 0;
		else if (!item || item.weight == 0)
			amount = max_amount;
		else
			amount = std::min((this->maxweight - this->weight) / item.weight, max_amount);
	}

	return std::min<int>(amount, this->world->config["MaxItem"]);
}